

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O1

void __thiscall Assimp::ColladaExporter::WriteDirectionalLight(ColladaExporter *this,aiLight *light)

{
  undefined1 *puVar1;
  ostream *poVar2;
  
  puVar1 = &this->field_0x38;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<directional>",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__cxx11::string::append((char *)&this->startstr);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<color sid=\"color\">",0x13);
  poVar2 = std::ostream::_M_insert<double>((double)(light->mColorDiffuse).r);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<double>((double)(light->mColorDiffuse).g);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<double>((double)(light->mColorDiffuse).b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</color>",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  PopTag(this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</directional>",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  return;
}

Assistant:

void ColladaExporter::WriteDirectionalLight(const aiLight *const light){
    const aiColor3D &color=  light->mColorDiffuse;
    mOutput << startstr << "<directional>" << endstr;
    PushTag();
    mOutput << startstr << "<color sid=\"color\">"
                            << color.r<<" "<<color.g<<" "<<color.b
                        <<"</color>" << endstr;

    PopTag();
    mOutput << startstr << "</directional>" << endstr;

}